

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw.c
# Opt level: O1

parasail_result_t *
parasail_sw(char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  parasail_result_t *ppVar8;
  int *ptr;
  int *ptr_00;
  int *ptr_01;
  int *ptr_02;
  int iVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  
  if (_s2 == (char *)0x0) {
    parasail_sw_cold_7();
  }
  else if (s2Len < 1) {
    parasail_sw_cold_6();
  }
  else if (open < 0) {
    parasail_sw_cold_5();
  }
  else if (gap < 0) {
    parasail_sw_cold_4();
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    parasail_sw_cold_3();
  }
  else {
    if (matrix->type == 0) {
      if (_s1 == (char *)0x0) {
        parasail_sw_cold_2();
        return (parasail_result_t *)0x0;
      }
      if (_s1Len < 1) {
        parasail_sw_cold_1();
        return (parasail_result_t *)0x0;
      }
    }
    else {
      _s1Len = matrix->length;
    }
    ppVar8 = parasail_result_new();
    if (ppVar8 != (parasail_result_t *)0x0) {
      ppVar8->flag = ppVar8->flag | 0x1400104;
      ptr = parasail_memalign_int(0x10,(ulong)(uint)s2Len);
      ptr_00 = parasail_memalign_int(0x10,(ulong)(s2Len + 1));
      ptr_01 = parasail_memalign_int(0x10,(ulong)(s2Len + 1));
      if (ptr_01 != (int *)0x0 && (ptr_00 != (int *)0x0 && ptr != (int *)0x0)) {
        if (matrix->type == 0) {
          ptr_02 = parasail_memalign_int(0x10,(long)_s1Len);
          if (ptr_02 == (int *)0x0) {
            return (parasail_result_t *)0x0;
          }
          if (0 < _s1Len) {
            piVar4 = matrix->mapper;
            uVar15 = 0;
            do {
              ptr_02[uVar15] = piVar4[(byte)_s1[uVar15]];
              uVar15 = uVar15 + 1;
            } while ((uint)_s1Len != uVar15);
          }
        }
        else {
          ptr_02 = (int *)0x0;
        }
        piVar4 = matrix->mapper;
        uVar15 = 1;
        if (1 < s2Len) {
          uVar15 = (ulong)(uint)s2Len;
        }
        uVar11 = 0;
        do {
          ptr[uVar11] = piVar4[(byte)_s2[uVar11]];
          uVar11 = uVar11 + 1;
        } while (uVar15 != uVar11);
        *ptr_00 = 0;
        *ptr_01 = -0x40000000;
        uVar11 = 0;
        do {
          ptr_00[uVar11 + 1] = 0;
          ptr_01[uVar11 + 1] = -0x40000000;
          uVar11 = uVar11 + 1;
        } while (uVar15 != uVar11);
        if (_s1Len < 1) {
          iVar9 = -0x40000000;
        }
        else {
          uVar7 = _s1Len + 1;
          iVar9 = -0x40000000;
          uVar11 = 1;
          do {
            if (matrix->type == 0) {
              lVar12 = (long)matrix->size;
              iVar2 = ptr_02[uVar11 - 1];
            }
            else {
              lVar12 = uVar11 - 1;
              iVar2 = matrix->size;
            }
            piVar4 = matrix->matrix;
            iVar16 = *ptr_00;
            *ptr_00 = 0;
            uVar14 = (int)uVar11 - 1;
            iVar17 = -0x40000000;
            iVar10 = 0;
            uVar18 = 0;
            do {
              iVar3 = ptr_00[uVar18 + 1];
              iVar13 = iVar3 - open;
              iVar5 = ptr_01[uVar18 + 1] - gap;
              if (ptr_01[uVar18 + 1] - gap < iVar13) {
                iVar5 = iVar13;
              }
              iVar17 = iVar17 - gap;
              if (iVar17 < iVar10 - open) {
                iVar17 = iVar10 - open;
              }
              ptr_01[uVar18 + 1] = iVar5;
              iVar10 = iVar16 + piVar4[iVar2 * lVar12 + (long)ptr[uVar18]];
              if (iVar10 <= iVar17) {
                iVar10 = iVar17;
              }
              if (iVar10 <= iVar5) {
                iVar10 = iVar5;
              }
              uVar1 = uVar18 + 1;
              if (iVar10 < 1) {
                iVar10 = 0;
              }
              ptr_00[uVar18 + 1] = iVar10;
              iVar16 = (int)uVar18;
              uVar6 = uVar14;
              if ((iVar10 <= iVar9) &&
                 (iVar16 = s2Len, uVar6 = _s1Len, (long)uVar1 <= (long)s2Len && iVar10 == iVar9)) {
                iVar16 = (int)uVar18;
                uVar6 = uVar14;
              }
              _s1Len = uVar6;
              s2Len = iVar16;
              if (iVar9 <= iVar10) {
                iVar9 = iVar10;
              }
              uVar18 = uVar1;
              iVar16 = iVar3;
            } while (uVar15 != uVar1);
            uVar11 = uVar11 + 1;
          } while (uVar11 != uVar7);
        }
        ppVar8->score = iVar9;
        ppVar8->end_query = _s1Len;
        ppVar8->end_ref = s2Len;
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        if (matrix->type == 0) {
          parasail_free(ptr_02);
          return ppVar8;
        }
        return ppVar8;
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* ENAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    parasail_result_t *result = NULL;
    int * restrict s1 = NULL;
    int * restrict s2 = NULL;
    int * restrict H = NULL;
    int * restrict F = NULL;
    int s1Len = 0;
    int i = 0;
    int j = 0;
    int score = 0;
    int end_query = 0;
    int end_ref = 0;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    i = 0;
    j = 0;
    score = NEG_INF_32;
    end_query = s1Len;
    end_ref = s2Len;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_NOVEC
        | PARASAIL_FLAG_BITS_INT | PARASAIL_FLAG_LANES_1;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2 = parasail_memalign_int(16, s2Len);
    H = parasail_memalign_int(16, s2Len+1);
    F = parasail_memalign_int(16, s2Len+1);

    /* validate heap variables */
    if (!s2) return NULL;
    if (!H) return NULL;
    if (!F) return NULL;

    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int(16, s1Len);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
    }

    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }

    /* upper left corner */
    H[0] = 0;
    F[0] = NEG_INF_32;
    
    /* first row */
    for (j=1; j<=s2Len; ++j) {
        H[j] = 0;
        F[j] = NEG_INF_32;
    }

    /* iter over first sequence */
    for (i=1; i<=s1Len; ++i) {
        const int * const restrict matrow =
            matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ?
            &matrix->matrix[matrix->size*s1[i-1]] :
            &matrix->matrix[matrix->size*(i-1)];
        /* init first column */
        int NH = H[0];
        int WH = 0;
        int E = NEG_INF_32;
        H[0] = WH;
        for (j=1; j<=s2Len; ++j) {
            int H_dag;
            int E_opn;
            int E_ext;
            int F_opn;
            int F_ext;
            int NWH = NH;
            NH = H[j];
            F_opn = NH - open;
            F_ext = F[j] - gap;
            F[j] = MAX(F_opn, F_ext);
            E_opn = WH - open;
            E_ext = E    - gap;
            E    = MAX(E_opn, E_ext);
            H_dag = NWH + matrow[s2[j-1]];
            WH = MAX(H_dag, 0);
            WH = MAX(WH, E);
            WH = MAX(WH, F[j]);
            H[j] = WH;
            if (WH > score) {
                end_query = i-1;
                end_ref = j-1;
            }
            else if (score == WH && j-1 < end_ref) {
                end_query = i-1;
                end_ref = j-1;
            }
            score = MAX(score,WH);
#ifdef PARASAIL_TABLE
            result->tables->score_table[1LL*(i-1)*s2Len + (j-1)] = WH;
#endif
        }
#ifdef PARASAIL_ROWCOL
        result->rowcols->score_col[i-1] = WH;
#endif
    }
#ifdef PARASAIL_ROWCOL
    for (j=1; j<=s2Len; ++j) {
        result->rowcols->score_row[j-1] = H[j];
    }
#endif

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(F);
    parasail_free(H);
    parasail_free(s2);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}